

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaItemListGrow(xmlSchemaItemListPtr list,int initialSize)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = 1;
  if (1 < initialSize) {
    uVar5 = initialSize;
  }
  uVar1 = list->sizeItems;
  if (0 < (int)uVar1) {
    if (999999999 < uVar1) {
      return -1;
    }
    uVar4 = uVar1 + 1 >> 1;
    uVar5 = uVar4 + uVar1;
    if (1000000000 - uVar4 < uVar1) {
      uVar5 = 1000000000;
    }
  }
  ppvVar3 = (void **)(*xmlRealloc)(list->items,(ulong)uVar5 << 3);
  if (ppvVar3 == (void **)0x0) {
    iVar2 = -1;
  }
  else {
    list->items = ppvVar3;
    list->sizeItems = uVar5;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaItemListGrow(xmlSchemaItemListPtr list, int initialSize)
{
    void **tmp;
    int newSize;

    if (initialSize <= 0)
        initialSize = 1;
    newSize = xmlGrowCapacity(list->sizeItems, sizeof(tmp[0]),
                              initialSize, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    tmp = xmlRealloc(list->items, newSize * sizeof(tmp[0]));
    if (tmp == NULL)
        return(-1);

    list->items = tmp;
    list->sizeItems = newSize;
    return(0);
}